

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O0

void de::BlockBufferCancelTest::runTest(void)

{
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  Consumer *this;
  Producer *this_00;
  reference ppTVar4;
  __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
  local_f8;
  __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
  local_f0;
  iterator thread;
  __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
  local_e0;
  __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
  local_d8;
  iterator i_2;
  __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
  local_c8;
  __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
  local_c0;
  iterator i_1;
  Consumer *local_b0;
  int local_a4;
  undefined1 local_a0 [4];
  int i;
  vector<de::Thread_*,_std::allocator<de::Thread_*>_> threads;
  int sleepMs;
  int numThreads;
  undefined1 local_70 [8];
  Random rnd;
  int iterNdx;
  int numIterations;
  BlockBuffer<unsigned_char> buffer;
  
  BlockBuffer<unsigned_char>::BlockBuffer((BlockBuffer<unsigned_char> *)&iterNdx,0x40,0x10);
  rnd.m_rnd.w = 8;
  for (rnd.m_rnd.z = 0; (int)rnd.m_rnd.z < 8; rnd.m_rnd.z = rnd.m_rnd.z + 1) {
    dVar2 = deInt32Hash(rnd.m_rnd.z);
    Random::Random((Random *)local_70,dVar2);
    iVar3 = Random::getInt((Random *)local_70,1,0x10);
    threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = Random::getInt((Random *)local_70,1,200);
    std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::vector
              ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0);
    for (local_a4 = 0; local_a4 < iVar3; local_a4 = local_a4 + 1) {
      bVar1 = Random::getBool((Random *)local_70);
      if (bVar1) {
        this = (Consumer *)operator_new(0x28);
        dVar2 = Random::getUint32((Random *)local_70);
        Consumer::Consumer(this,(BlockBuffer<unsigned_char> *)&iterNdx,dVar2);
        local_b0 = this;
        std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::push_back
                  ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0,
                   (value_type *)&local_b0);
      }
      else {
        this_00 = (Producer *)operator_new(0x28);
        dVar2 = Random::getUint32((Random *)local_70);
        Producer::Producer(this_00,(BlockBuffer<unsigned_char> *)&iterNdx,dVar2);
        i_1._M_current = (Thread **)this_00;
        std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::push_back
                  ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0,
                   (value_type *)&i_1);
      }
    }
    local_c0._M_current =
         (Thread **)
         std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::begin
                   ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0);
    while( true ) {
      local_c8._M_current =
           (Thread **)
           std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::end
                     ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0);
      bVar1 = __gnu_cxx::operator!=(&local_c0,&local_c8);
      if (!bVar1) break;
      ppTVar4 = __gnu_cxx::
                __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
                ::operator*(&local_c0);
      Thread::start(*ppTVar4);
      i_2._M_current =
           (Thread **)
           __gnu_cxx::
           __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
           ::operator++(&local_c0,0);
    }
    deSleep(threads.super__Vector_base<de::Thread_*,_std::allocator<de::Thread_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_);
    BlockBuffer<unsigned_char>::cancel((BlockBuffer<unsigned_char> *)&iterNdx);
    local_d8._M_current =
         (Thread **)
         std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::begin
                   ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0);
    while( true ) {
      local_e0._M_current =
           (Thread **)
           std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::end
                     ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0);
      bVar1 = __gnu_cxx::operator!=(&local_d8,&local_e0);
      if (!bVar1) break;
      ppTVar4 = __gnu_cxx::
                __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
                ::operator*(&local_d8);
      Thread::join(*ppTVar4);
      thread._M_current =
           (Thread **)
           __gnu_cxx::
           __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
           ::operator++(&local_d8,0);
    }
    BlockBuffer<unsigned_char>::clear((BlockBuffer<unsigned_char> *)&iterNdx);
    local_f0._M_current =
         (Thread **)
         std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::begin
                   ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0);
    while( true ) {
      local_f8._M_current =
           (Thread **)
           std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::end
                     ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0);
      bVar1 = __gnu_cxx::operator!=(&local_f0,&local_f8);
      if (!bVar1) break;
      ppTVar4 = __gnu_cxx::
                __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>
                ::operator*(&local_f0);
      if (*ppTVar4 != (Thread *)0x0) {
        (*(*ppTVar4)->_vptr_Thread[1])();
      }
      __gnu_cxx::
      __normal_iterator<de::Thread_**,_std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>_>::
      operator++(&local_f0);
    }
    std::vector<de::Thread_*,_std::allocator<de::Thread_*>_>::~vector
              ((vector<de::Thread_*,_std::allocator<de::Thread_*>_> *)local_a0);
    Random::~Random((Random *)local_70);
  }
  BlockBuffer<unsigned_char>::~BlockBuffer((BlockBuffer<unsigned_char> *)&iterNdx);
  return;
}

Assistant:

void runTest (void)
{
	BlockBuffer<deUint8>	buffer			(64, 16);
	const int				numIterations	= 8;

	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		Random				rnd				(deInt32Hash(iterNdx));
		int					numThreads		= rnd.getInt(1, 16);
		int					sleepMs			= rnd.getInt(1, 200);
		vector<Thread*>		threads;

		for (int i = 0; i < numThreads; i++)
		{
			if (rnd.getBool())
				threads.push_back(new Consumer(&buffer, rnd.getUint32()));
			else
				threads.push_back(new Producer(&buffer, rnd.getUint32()));
		}

		// Start threads.
		for (vector<Thread*>::iterator i = threads.begin(); i != threads.end(); i++)
			(*i)->start();

		// Sleep for a while.
		deSleep(sleepMs);

		// Cancel buffer.
		buffer.cancel();

		// Wait for threads to finish.
		for (vector<Thread*>::iterator i = threads.begin(); i != threads.end(); i++)
			(*i)->join();

		// Reset buffer.
		buffer.clear();

		// Delete threads
		for (vector<Thread*>::iterator thread = threads.begin(); thread != threads.end(); ++thread)
			delete *thread;
	}
}